

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::resizeEvent(QWizard *this,QResizeEvent *event)

{
  QWizardPrivate *this_00;
  QResizeEvent *in_RSI;
  undefined8 in_RDI;
  int heightOffset;
  QWizardPrivate *d;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  
  this_00 = d_func((QWizard *)0x7bc6f1);
  uVar1 = 0;
  QResizeEvent::size(in_RSI);
  QSize::width((QSize *)0x7bc720);
  QResizeEvent::size(in_RSI);
  QSize::height((QSize *)0x7bc736);
  QWidget::resize((QWidget *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),(int)((ulong)in_RDI >> 0x20),
                  (int)in_RDI);
  QDialog::resizeEvent((QDialog *)this_00,(QResizeEvent *)CONCAT44(uVar1,in_stack_ffffffffffffffe0))
  ;
  return;
}

Assistant:

void QWizard::resizeEvent(QResizeEvent *event)
{
    Q_D(QWizard);
    int heightOffset = 0;
#if QT_CONFIG(style_windowsvista)
    if (d->isVistaThemeEnabled()) {
        heightOffset = d->vistaHelper->topOffset(this);
        heightOffset += d->vistaHelper->titleBarSize();
    }
#endif
    d->antiFlickerWidget->resize(event->size().width(), event->size().height() - heightOffset);
#if QT_CONFIG(style_windowsvista)
    if (d->isVistaThemeEnabled())
        d->vistaHelper->resizeEvent(event);
#endif
    QDialog::resizeEvent(event);
}